

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall
cs::instance_type::check_define_var(instance_type *this,iterator it,bool regist,bool constant)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  token_base *ptVar3;
  int iVar4;
  token_base **pptVar5;
  iterator it_00;
  internal_error *piVar6;
  runtime_error *prVar7;
  _func_int **pp_Var8;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var9;
  size_t sVar10;
  undefined1 local_60 [32];
  iterator local_40;
  instance_type *local_38;
  
  local_40.mData = it.mData;
  local_38 = this;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&local_40);
  if (*pptVar5 == (token_base *)0x0) {
    piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Null pointer accessed.","");
    internal_error::internal_error(piVar6,(string *)local_60);
    __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&local_40);
  iVar4 = (*(*pptVar5)->_vptr_token_base[2])();
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&local_40);
  ptVar1 = *pptVar5;
  if (iVar4 == 0xf) {
    pp_Var9 = ptVar1[2]._vptr_token_base;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    if (pp_Var9 != pp_Var2) {
      pp_Var8 = ptVar1[3]._vptr_token_base;
      sVar10 = ptVar1[3].line_num;
      do {
        check_define_var(local_38,(tree_node *)*pp_Var9,regist,constant);
        pp_Var9 = pp_Var9 + 1;
        if (pp_Var9 == pp_Var8) {
          pp_Var9 = *(_func_int ***)(sVar10 + 8);
          sVar10 = sVar10 + 8;
          pp_Var8 = pp_Var9 + 0x40;
        }
      } while (pp_Var9 != pp_Var2);
    }
  }
  else {
    if (ptVar1 == (token_base *)0x0) {
      piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
      local_60._0_8_ = local_60 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"Null pointer accessed.","");
      internal_error::internal_error(piVar6,(string *)local_60);
      __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar4 != 3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_60._0_8_ = local_60 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"Wrong grammar for variable definition(1).","");
      runtime_error::runtime_error(prVar7,(string *)local_60);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (*(int *)&ptVar1[1]._vptr_token_base == 0x35) {
      local_60._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_40);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      if ((constant) &&
         ((*pptVar5 == (token_base *)0x0 ||
          (iVar4 = (*(*pptVar5)->_vptr_token_base[2])(), iVar4 != 7)))) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Wrong grammar for constant variable definition(4).","");
        runtime_error::runtime_error(prVar7,(string *)local_60);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      it_00 = tree_type<cs::token_base_*>::iterator::left(&local_40);
      check_define_structured_binding(local_38,it_00,regist);
    }
    else {
      if (*(int *)&ptVar1[1]._vptr_token_base != 0x11) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Wrong grammar for variable definition(5).","");
        runtime_error::runtime_error(prVar7,(string *)local_60);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_60._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_40);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      ptVar1 = *pptVar5;
      local_60._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_40);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      if (((ptVar1 == (token_base *)0x0) || (ptVar3 = *pptVar5, ptVar3 == (token_base *)0x0)) ||
         (iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar4 != 4)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Wrong grammar for variable definition(2).","");
        runtime_error::runtime_error(prVar7,(string *)local_60);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      if ((constant) && (iVar4 = (*ptVar3->_vptr_token_base[2])(ptVar3), iVar4 != 7)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Wrong grammar for constant variable definition(3).","");
        runtime_error::runtime_error(prVar7,(string *)local_60);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      if (regist) {
        domain_manager::add_record(&(local_38->super_runtime_type).storage,(string *)(ptVar1 + 3));
      }
    }
  }
  return;
}

Assistant:

void instance_type::check_define_var(tree_type<token_base *>::iterator it, bool regist, bool constant)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_define_var(t.root(), regist, constant);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr)
				throw internal_error("Null pointer accessed.");
			if (root->get_type() != token_types::signal)
				throw runtime_error("Wrong grammar for variable definition(1).");
			switch (static_cast<token_signal *>(root)->get_signal()) {
			case signal_types::asi_: {
				token_base *left = it.left().data();
				token_base *right = it.right().data();
				if (left == nullptr || right == nullptr || left->get_type() != token_types::id)
					throw runtime_error("Wrong grammar for variable definition(2).");
				if (constant && right->get_type() != token_types::value)
					throw runtime_error("Wrong grammar for constant variable definition(3).");
				if (regist)
					storage.add_record(static_cast<token_id *>(left)->get_id());
				break;
			}
			case signal_types::bind_: {
				token_base *right = it.right().data();
				if (constant && (right == nullptr || right->get_type() != token_types::value))
					throw runtime_error("Wrong grammar for constant variable definition(4).");
				check_define_structured_binding(it.left(), regist);
				break;
			}
			default:
				throw runtime_error("Wrong grammar for variable definition(5).");
			}
		}
	}